

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdata.cpp
# Opt level: O1

int32_t __thiscall icu_63::CollationData::getGroupForPrimary(CollationData *this,uint32_t p)

{
  uint16_t *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  puVar1 = this->scriptStarts;
  if (((uint)puVar1[1] <= p >> 0x10) &&
     (p >> 0x10 < (uint)puVar1[(long)this->scriptStartsLength + -1])) {
    uVar3 = 0;
    do {
      uVar2 = uVar3 + 1;
      lVar5 = uVar3 + 2;
      uVar3 = uVar2;
    } while (puVar1[lVar5] <= (ushort)(p >> 0x10));
    uVar3 = (ulong)this->numScripts;
    if (0 < (long)uVar3) {
      uVar4 = 0;
      do {
        if (this->scriptsIndex[uVar4] == uVar2) goto LAB_002312c8;
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    lVar5 = 0;
    do {
      if (this->scriptsIndex[uVar3 + lVar5] == uVar2) {
        uVar4 = (ulong)((int)lVar5 + 0x1000);
LAB_002312c8:
        return (int32_t)uVar4;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 8);
  }
  return -1;
}

Assistant:

int32_t
CollationData::getGroupForPrimary(uint32_t p) const {
    p >>= 16;
    if(p < scriptStarts[1] || scriptStarts[scriptStartsLength - 1] <= p) {
        return -1;
    }
    int32_t index = 1;
    while(p >= scriptStarts[index + 1]) { ++index; }
    for(int32_t i = 0; i < numScripts; ++i) {
        if(scriptsIndex[i] == index) {
            return i;
        }
    }
    for(int32_t i = 0; i < MAX_NUM_SPECIAL_REORDER_CODES; ++i) {
        if(scriptsIndex[numScripts + i] == index) {
            return UCOL_REORDER_CODE_FIRST + i;
        }
    }
    return -1;
}